

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_123::LimitedInputStream::decreaseLimit
          (LimitedInputStream *this,uint64_t amount,uint64_t requested)

{
  char (*params) [36];
  Fault f;
  Array<char> local_1c0;
  uint64_t amount_local;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  
  _kjCondition.right = &amount_local;
  _kjCondition.left = &this->limit;
  _kjCondition.op.content.ptr = " >= ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = amount <= this->limit;
  amount_local = amount;
  if (_kjCondition.result) {
    params = (char (*) [36])(this->limit - amount);
    *_kjCondition.left = (unsigned_long)params;
    if (params == (char (*) [36])0x0) {
      Own<kj::AsyncInputStream,_std::nullptr_t>::dispose(&this->inner);
    }
    else if (amount < requested) {
      kj::_::Debug::makeDescription<char_const(&)[36]>
                ((String *)&local_1c0,(Debug *)"\"fixed-length pipe ended prematurely\"",
                 "fixed-length pipe ended prematurely",params);
      Exception::Exception
                ((Exception *)&_kjCondition,DISCONNECTED,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
                 ,0x69f,(String *)&local_1c0);
      throwRecoverableException((Exception *)&_kjCondition,0);
      Exception::~Exception((Exception *)&_kjCondition);
      Array<char>::~Array(&local_1c0);
    }
    return;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x699,FAILED,"limit >= amount","_kjCondition,",&_kjCondition);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void decreaseLimit(uint64_t amount, uint64_t requested) {
    KJ_ASSERT(limit >= amount);
    limit -= amount;
    if (limit == 0) {
      inner = nullptr;
    } else if (amount < requested) {
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED,
          "fixed-length pipe ended prematurely"));
    }
  }